

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  ulong uVar1;
  long lVar2;
  ctrl_t *pcVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  bool bVar6;
  slot_type *ppFVar7;
  uint64_t uVar8;
  ulong uVar9;
  size_t sVar10;
  byte bVar11;
  uint64_t v_1;
  byte bVar12;
  ctrl_t cVar13;
  ulong uVar14;
  size_t sVar15;
  uint64_t v;
  FindInfo FVar16;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  char local_3f;
  byte local_3e;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, std::allocator<const google::protobuf::FileDescriptor *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("(!set->fits_in_soo(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe93,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, std::allocator<const google::protobuf::FileDescriptor *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                 );
  }
  sVar10 = common->capacity_;
  if (sVar10 == 0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, std::allocator<const google::protobuf::FileDescriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                 );
  }
  bVar11 = 0x80;
  if (sVar10 == 1) {
    AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)0x1);
    if (1 < common->size_) {
      ppFVar7 = soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          *)common);
      uVar1 = (*ppFVar7)->name_->_M_string_length;
      uVar8 = hash_internal::MixingHashState::CombineContiguousImpl
                        (&hash_internal::MixingHashState::kSeed,
                         ((*ppFVar7)->name_->_M_dataplus)._M_p,uVar1);
      bVar11 = (byte)((uVar8 ^ uVar1) * 0x5cb22ca68cb134ed >> 0x38) & 0x7f;
      bVar12 = 1;
      goto LAB_00177be8;
    }
  }
  bVar12 = 0;
LAB_00177be8:
  local_48 = common->capacity_;
  local_40 = (byte)common->size_ & 1;
  local_3f = sVar10 == 1;
  local_58.heap.control = (common->heap_or_soo_).heap.control;
  local_58.heap.slot_array =
       (MaybeInitializedPtr)((MaybeInitializedPtr *)((long)&common->heap_or_soo_ + 8))->p;
  local_3e = bVar12;
  CommonFields::set_capacity(common,new_capacity);
  bVar6 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,8ul,true,true,8ul>
                    ((HashSetResizeHelper *)&local_58,common,&local_59,(int)(char)bVar11,8,8);
  if (local_48 == 0) {
    __assert_fail("(resize_helper.old_capacity() > 0) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xeb6,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, std::allocator<const google::protobuf::FileDescriptor *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                 );
  }
  if ((bVar12 | sVar10 != 1) == 1) {
    lVar2 = *(long *)((long)&common->heap_or_soo_ + 8);
    slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)common->capacity_);
    uVar5 = local_58.heap.slot_array;
    if (!bVar6) {
      if (sVar10 == 1) {
        uVar1 = (*(undefined8 **)(local_58.heap.control + 8))[1];
        uVar8 = hash_internal::MixingHashState::CombineContiguousImpl
                          (&hash_internal::MixingHashState::kSeed,
                           **(undefined8 **)(local_58.heap.control + 8),uVar1);
        uVar14 = (uVar8 ^ uVar1) * -0x234dd359734ecb13;
        FVar16 = find_first_non_full<void>
                           (common,uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
                                   (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8
                                   | (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 |
                                   (uVar14 & 0xff00) << 0x28 | uVar14 << 0x38);
        uVar9 = FVar16.offset;
        uVar1 = common->capacity_;
        if (uVar1 <= uVar9) {
LAB_00177e2c:
          __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x744,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar13 = (ctrl_t)(uVar14 >> 0x38) & ~kEmpty;
        pcVar3 = (common->heap_or_soo_).heap.control;
        pcVar3[uVar9] = cVar13;
        pcVar3[(ulong)((uint)uVar1 & 0xf) + (uVar9 - 0xf & uVar1)] = cVar13;
        common->capacity_ = 0xffffffffffffff9c;
        *(ctrl_t **)(lVar2 + uVar9 * 8) = local_58.heap.control;
        CommonFields::set_capacity(common,uVar1);
      }
      else {
        if (local_3f == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_48 != 0) {
          sVar15 = 0;
          sVar10 = local_48;
          do {
            if (local_3f == '\x01') {
              __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7e6,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (kSentinel < local_58.heap.control[sVar15]) {
              puVar4 = *(undefined8 **)(*(long *)(uVar5 + sVar15 * 8) + 8);
              uVar1 = puVar4[1];
              uVar8 = hash_internal::MixingHashState::CombineContiguousImpl
                                (&hash_internal::MixingHashState::kSeed,*puVar4,uVar1);
              uVar14 = (uVar8 ^ uVar1) * -0x234dd359734ecb13;
              FVar16 = find_first_non_full<void>
                                 (common,uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
                                         (uVar14 & 0xff0000000000) >> 0x18 |
                                         (uVar14 & 0xff00000000) >> 8 | (uVar14 & 0xff000000) << 8 |
                                         (uVar14 & 0xff0000) << 0x18 | (uVar14 & 0xff00) << 0x28 |
                                         uVar14 << 0x38);
              uVar9 = FVar16.offset;
              uVar1 = common->capacity_;
              if (uVar1 <= uVar9) goto LAB_00177e2c;
              cVar13 = (ctrl_t)(uVar14 >> 0x38) & ~kEmpty;
              pcVar3 = (common->heap_or_soo_).heap.control;
              pcVar3[uVar9] = cVar13;
              pcVar3[(ulong)((uint)uVar1 & 0xf) + (uVar9 - 0xf & uVar1)] = cVar13;
              common->capacity_ = 0xffffffffffffff9c;
              *(undefined8 *)(lVar2 + uVar9 * 8) = *(undefined8 *)(uVar5 + sVar15 * 8);
              CommonFields::set_capacity(common,uVar1);
              sVar10 = local_48;
            }
            sVar15 = sVar15 + 1;
          } while (sVar15 != sVar10);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
        HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_58,&local_5a,8);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }